

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcDisassembler.c
# Opt level: O1

DecodeStatus
DecodeMem(MCInst *MI,uint insn,uint64_t Address,void *Decoder,_Bool isLoad,DecodeFunc DecodeRD)

{
  DecodeStatus DVar1;
  uint uVar2;
  undefined3 in_register_00000081;
  uint uVar3;
  
  uVar2 = insn >> 0x19 & 0x1f;
  uVar3 = 0;
  if ((insn >> 0xd & 1) == 0) {
    uVar3 = insn & 0x1f;
  }
  if ((CONCAT31(in_register_00000081,isLoad) != 0) &&
     (DVar1 = (*DecodeRD)(MI,uVar2,Address,Decoder), DVar1 != MCDisassembler_Success)) {
    return DVar1;
  }
  MCOperand_CreateReg0(MI,IntRegDecoderTable[insn >> 0xe & 0x1f]);
  if ((insn >> 0xd & 1) == 0) {
    MCOperand_CreateReg0(MI,IntRegDecoderTable[uVar3]);
  }
  else {
    MCOperand_CreateImm0
              (MI,(ulong)(uint)((int)(insn << 0x13) >> 0x13 & (int)(insn << 0x12) >> 0x1f));
  }
  if ((!isLoad) && (DVar1 = (*DecodeRD)(MI,uVar2,Address,Decoder), DVar1 != MCDisassembler_Success))
  {
    return DVar1;
  }
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMem(MCInst *MI, unsigned insn, uint64_t Address,
		const void *Decoder,
		bool isLoad, DecodeFunc DecodeRD)
{
	DecodeStatus status;
	unsigned rd = fieldFromInstruction_4(insn, 25, 5);
	unsigned rs1 = fieldFromInstruction_4(insn, 14, 5);
	bool isImm = fieldFromInstruction_4(insn, 13, 1) != 0;
	unsigned rs2 = 0;
	unsigned simm13 = 0;

	if (isImm)
		simm13 = SignExtend32(fieldFromInstruction_4(insn, 0, 13), 13);
	else
		rs2 = fieldFromInstruction_4(insn, 0, 5);

	if (isLoad) {
		status = DecodeRD(MI, rd, Address, Decoder);
		if (status != MCDisassembler_Success)
			return status;
	}

	// Decode rs1.
	status = DecodeIntRegsRegisterClass(MI, rs1, Address, Decoder);
	if (status != MCDisassembler_Success)
		return status;

	// Decode imm|rs2.
	if (isImm)
		MCOperand_CreateImm0(MI, simm13);
	else {
		status = DecodeIntRegsRegisterClass(MI, rs2, Address, Decoder);
		if (status != MCDisassembler_Success)
			return status;
	}

	if (!isLoad) {
		status = DecodeRD(MI, rd, Address, Decoder);
		if (status != MCDisassembler_Success)
			return status;
	}

	return MCDisassembler_Success;
}